

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

void m2v_multadd_row(m2v *M1,int r1,int alpha,m2v *Mt,int rt)

{
  int iVar1;
  int iVar2;
  m2v *in_RCX;
  int in_EDX;
  int in_ESI;
  m2v *in_RDI;
  int in_R8D;
  int i;
  int ot;
  int o1;
  int local_28;
  
  if (in_EDX != 0) {
    iVar1 = m2v__get_word(in_RDI,in_ESI,0);
    iVar2 = m2v__get_word(in_RCX,in_R8D,0);
    for (local_28 = 0; local_28 < in_RCX->row_stride; local_28 = local_28 + 1) {
      in_RCX->e[iVar2 + local_28] = in_RDI->e[iVar1 + local_28] ^ in_RCX->e[iVar2 + local_28];
    }
  }
  return;
}

Assistant:

void m2v_multadd_row(const m2v* M1,
			int r1,
			int alpha,
			m2v* Mt,
			int rt)
{
	assert(M1->n_col == Mt->n_col);
	assert(0 <= r1 && r1 < M1->n_row);
	assert(0 <= rt && rt < Mt->n_row);
	if (alpha == 0)
		return;

	const int o1 = get_word(M1, r1, 0);
	const int ot = get_word(Mt, rt, 0);
	for (int i = 0; i < Mt->row_stride; ++i) {
		Mt->e[ot + i] ^= M1->e[o1 + i];
	}
}